

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

bool FIX::BoolConvertor::convert(string *value)

{
  bool bVar1;
  FieldConvertError *this;
  bool local_11;
  string *psStack_10;
  bool result;
  string *value_local;
  
  local_11 = false;
  psStack_10 = value;
  bVar1 = convert(value,&local_11);
  if (!bVar1) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,psStack_10);
    __cxa_throw(this,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  return (bool)(local_11 & 1);
}

Assistant:

EXCEPT(FieldConvertError) {
    bool result = false;
    if (!convert(value, result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }